

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

string * tyhp_make_real_url(string *__return_storage_ptr__,string *url)

{
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_68 [36];
  int local_44;
  undefined1 local_40 [4];
  int n;
  string url2;
  string *url_local;
  string *real_url;
  
  url2.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::string((string *)local_40);
  local_44 = 0;
  local_44 = std::__cxx11::string::find((string *)url,0x1184f8);
  if (local_44 == -1) {
    std::__cxx11::string::operator=((string *)local_40,(string *)url);
  }
  else {
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_68,(ulong)url);
    std::__cxx11::string::operator=((string *)local_40,local_68);
    std::__cxx11::string::~string(local_68);
  }
  std::__cxx11::string::size();
  pcVar1 = (char *)std::__cxx11::string::operator[](0x118518);
  if (*pcVar1 == '/') {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (*pcVar1 == '/') {
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::__cxx11::string::erase((ulong)local_40,0);
      std::operator+(&local_98,&tyhp_docroot_abi_cxx11_,__rhs);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
    }
    else {
      std::operator+(&local_b8,&tyhp_docroot_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  else {
    pcVar1 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
    if (*pcVar1 == '/') {
      std::operator+(&local_d8,&tyhp_docroot_abi_cxx11_,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    else {
      std::operator+(&local_118,&tyhp_docroot_abi_cxx11_,'/');
      std::operator+(&local_f8,&local_118,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_118);
    }
  }
  url2.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)local_40);
  if ((url2.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

string tyhp_make_real_url(const string& url)
{
	string real_url, url2;

	int n = 0;
	
	if((n = url.find(tyhp_domain, 0)) != string::npos)//url中包含域名，要将其删去
		url2 = url.substr(tyhp_domain.size(), url.size() - tyhp_domain.size());
	else
		url2 = url;

	if(tyhp_docroot[tyhp_docroot.size() - 1] == '/')//配置项docroot末尾有'/'
	{
		if(url2[0] == '/')
			real_url = tyhp_docroot + url2.erase(0, 1);
		else
			real_url = tyhp_docroot + url2;
	}
	else//配置项docroot末尾没有'\'
	{
		if(url2[0] == '/')
			real_url = tyhp_docroot + url2;
		else
			real_url = tyhp_docroot + '/' + url2;
	}

	return real_url;
}